

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptRegExpConstructor::GetPropertyBuiltIns
          (JavascriptRegExpConstructor *this,PropertyId propertyId,Var *value,BOOL *result)

{
  JavascriptString **ppJVar1;
  void **ppvVar2;
  BOOL *result_local;
  Var *value_local;
  PropertyId propertyId_local;
  JavascriptRegExpConstructor *this_local;
  
  switch(propertyId) {
  case 0x1d0:
  case 0x1db:
    EnsureValues(this);
    ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                        ((WriteBarrierPtr *)&this->lastInput);
    *value = *ppJVar1;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d1:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 1));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d2:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 2));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d3:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 3));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d4:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 4));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d5:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 5));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d6:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 6));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d7:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 7));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d8:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 8));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1d9:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)(this->captures + 9));
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1da:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->index);
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1dc:
  case 0x1e3:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)this->captures);
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1dd:
  case 0x1e4:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->lastParen);
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1de:
  case 0x1e5:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->leftContext);
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  case 0x1df:
  case 0x1e6:
    EnsureValues(this);
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->rightContext);
    *value = *ppvVar2;
    *result = 1;
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool JavascriptRegExpConstructor::GetPropertyBuiltIns(PropertyId propertyId, Var* value, BOOL* result)
    {
        switch (propertyId)
        {
        case PropertyIds::input:
        case PropertyIds::$_:
            this->EnsureValues();
            *value = this->lastInput;
            *result = true;
            return true;
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
            this->EnsureValues();
            *value = this->captures[0];
            *result = true;
            return true;
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
            this->EnsureValues();
            *value = this->lastParen;
            *result = true;
            return true;
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
            this->EnsureValues();
            *value = this->leftContext;
            *result = true;
            return true;
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
            this->EnsureValues();
            *value = this->rightContext;
            *result = true;
            return true;
        case PropertyIds::$1:
            this->EnsureValues();
            *value = this->captures[1];
            *result = true;
            return true;
        case PropertyIds::$2:
            this->EnsureValues();
            *value = this->captures[2];
            *result = true;
            return true;
        case PropertyIds::$3:
            this->EnsureValues();
            *value = this->captures[3];
            *result = true;
            return true;
        case PropertyIds::$4:
            this->EnsureValues();
            *value = this->captures[4];
            *result = true;
            return true;
        case PropertyIds::$5:
            this->EnsureValues();
            *value = this->captures[5];
            *result = true;
            return true;
        case PropertyIds::$6:
            this->EnsureValues();
            *value = this->captures[6];
            *result = true;
            return true;
        case PropertyIds::$7:
            this->EnsureValues();
            *value = this->captures[7];
            *result = true;
            return true;
        case PropertyIds::$8:
            this->EnsureValues();
            *value = this->captures[8];
            *result = true;
            return true;
        case PropertyIds::$9:
            this->EnsureValues();
            *value = this->captures[9];
            *result = true;
            return true;
        case PropertyIds::index:
            this->EnsureValues();
            *value = this->index;
            *result = true;
            return true;
        default:
            return false;
        }
    }